

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O0

vector<unsigned_short,_std::allocator<unsigned_short>_> *
flatbuffers::anon_unknown_0::ExtractProtobufIds
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
          vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields)

{
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *this;
  bool bVar1;
  int iVar2;
  reference ppFVar3;
  ulong uVar4;
  char *s;
  unsigned_short local_5a;
  bool done;
  Value *pVStack_58;
  voffset_t proto_id;
  Value *id_attribute;
  FieldDef *field;
  const_iterator __end2;
  const_iterator __begin2;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range2;
  allocator<char> local_19;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *local_18;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *used_proto_ids;
  
  local_18 = fields;
  fields_local = (vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                 __return_storage_ptr__;
  if (((anonymous_namespace)::
       ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
       ::ID_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                                   ::ID_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &(anonymous_namespace)::
                ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                ::ID_abi_cxx11_,"id",&local_19);
    std::allocator<char>::~allocator(&local_19);
    __cxa_atexit(std::__cxx11::string::~string,
                 &(anonymous_namespace)::
                  ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                  ::ID_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                         ::ID_abi_cxx11_);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(__return_storage_ptr__);
  this = local_18;
  __end2 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     (local_18);
  field = (FieldDef *)
          std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end(this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                     *)&field), bVar1) {
    ppFVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&__end2);
    id_attribute = (Value *)*ppFVar3;
    pVStack_58 = SymbolTable<flatbuffers::Value>::Lookup
                           (&(((FieldDef *)id_attribute)->super_Definition).attributes,
                            &(anonymous_namespace)::
                             ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                             ::ID_abi_cxx11_);
    if ((pVStack_58 != (Value *)0x0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
      local_5a = 0;
      s = (char *)std::__cxx11::string::c_str();
      bVar1 = StringToNumber<unsigned_short>(s,&local_5a);
      if (bVar1) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (__return_storage_ptr__,&local_5a);
      }
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<voffset_t> ExtractProtobufIds(
    const std::vector<FieldDef *> &fields) {
  static const std::string ID = "id";
  std::vector<voffset_t> used_proto_ids;
  for (const auto *field : fields) {
    const auto *id_attribute = field->attributes.Lookup(ID);
    if (id_attribute != nullptr && !id_attribute->constant.empty()) {
      voffset_t proto_id = 0;
      bool done = StringToNumber(id_attribute->constant.c_str(), &proto_id);
      if (done) { used_proto_ids.push_back(proto_id); }
    }
  }

  return used_proto_ids;
}